

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

QDebug operator<<(QDebug debug,QGraphicsObject *item)

{
  long lVar1;
  undefined8 uVar2;
  char *t;
  QDebug *pQVar3;
  undefined8 *in_RDX;
  long in_FS_OFFSET;
  QDebug local_58;
  QArrayDataPointer<char16_t> local_50;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)item);
  *(undefined1 *)(*(long *)item + 0x30) = 0;
  if (in_RDX == (undefined8 *)0x0) {
    QDebug::operator<<((QDebug *)item,"QGraphicsObject(0)");
  }
  else {
    (**(code **)*in_RDX)();
    t = (char *)QMetaObject::className();
    pQVar3 = QDebug::operator<<((QDebug *)item,t);
    pQVar3 = QDebug::operator<<(pQVar3,'(');
    QDebug::operator<<(pQVar3,in_RDX);
    QObject::objectName();
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    if (local_50.size != 0) {
      pQVar3 = QDebug::operator<<((QDebug *)item,", name=");
      QObject::objectName();
      QDebug::operator<<(pQVar3,(QString *)&local_50);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    }
    local_58.stream = *(Stream **)item;
    *(int *)(local_58.stream + 0x28) = *(int *)(local_58.stream + 0x28) + 1;
    formatGraphicsItemHelper(&local_58,(QGraphicsItem *)(in_RDX + 2));
    QDebug::~QDebug(&local_58);
    QDebug::operator<<((QDebug *)item,')');
  }
  uVar2 = *(undefined8 *)item;
  *(undefined8 *)item = 0;
  *(undefined8 *)debug.stream = uVar2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QGraphicsObject *item)
{
    QDebugStateSaver saver(debug);
    debug.nospace();

    if (!item) {
        debug << "QGraphicsObject(0)";
        return debug;
    }

    debug << item->metaObject()->className() << '(' << static_cast<const void *>(item);
    if (!item->objectName().isEmpty())
        debug << ", name=" << item->objectName();
    formatGraphicsItemHelper(debug, item);
    debug << ')';
    return debug;
}